

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<void> __thiscall capnp::Capability::Client::whenResolved(Client *this)

{
  _func_int **node;
  long *plVar1;
  long in_RSI;
  ClientHook local_28;
  long *local_18;
  
  ClientHook::whenResolved(&local_28);
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(&local_28.brand);
  kj::Promise<void>::attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<capnp::ClientHook,_std::nullptr_t> *)&local_28);
  plVar1 = local_18;
  if (local_18 != (long *)0x0) {
    local_18 = (long *)0x0;
    (*(code *)**local_28.brand)(local_28.brand,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  node = local_28._vptr_ClientHook;
  if ((PromiseArenaMember *)local_28._vptr_ClientHook != (PromiseArenaMember *)0x0) {
    local_28._vptr_ClientHook = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> Capability::Client::whenResolved() {
  return hook->whenResolved().attach(hook->addRef());
}